

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool checkCanImportFromRootPaths(Options *options,QString *absolutePath,QString *moduleUrlPath)

{
  pointer pQVar1;
  pointer pQVar2;
  bool bVar3;
  pointer pQVar4;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_const_QString_&> local_78;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (options->rootPaths).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pQVar2 = (options->rootPaths).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    pQVar4 = pQVar2;
    if (pQVar4 == pQVar1) break;
    local_50.d = (pQVar4->d).d;
    local_50.ptr = (pQVar4->d).ptr;
    local_50.size = (pQVar4->d).size;
    if (local_50.d != (Data *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_78.a = (QString *)&local_50;
    local_78.b = moduleUrlPath;
    QStringBuilder<QString_&,_const_QString_&>::convertTo<QString>((QString *)&local_68,&local_78);
    bVar3 = comparesEqual((QString *)&local_68,absolutePath);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    pQVar2 = pQVar4 + 1;
  } while (!bVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar4 != pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool checkCanImportFromRootPaths(const Options *options, const QString &absolutePath,
                                 const QString &moduleUrlPath)
{
    for (auto rootPath : options->rootPaths) {
        if ((rootPath + moduleUrlPath) == absolutePath)
            return true;
    }
    return false;
}